

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

Model * gvr::loadModel(char *name,char *spath,bool verbose,bool merge_double_vertices)

{
  long lVar1;
  Model *pMVar2;
  string s;
  allocator local_49;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  std::__cxx11::string::string((string *)&local_48,name,&local_49);
  lVar1 = std::__cxx11::string::rfind((char *)&local_48,0x16355e,0xffffffffffffffff);
  if (lVar1 != local_40 + -4) {
    lVar1 = std::__cxx11::string::rfind((char *)&local_48,0x163563,0xffffffffffffffff);
    if (lVar1 != local_40 + -4) {
      lVar1 = std::__cxx11::string::rfind((char *)&local_48,0x163ce0,0xffffffffffffffff);
      if (lVar1 != local_40 + -4) {
        lVar1 = std::__cxx11::string::rfind((char *)&local_48,0x163ce5,0xffffffffffffffff);
        if (lVar1 != local_40 + -4) {
          pMVar2 = loadDepth(name,spath,verbose);
          goto LAB_00121344;
        }
      }
      pMVar2 = loadPLY(name);
      goto LAB_00121344;
    }
  }
  pMVar2 = loadSTL(name,merge_double_vertices);
LAB_00121344:
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return pMVar2;
}

Assistant:

Model *loadModel(const char *name, const char *spath, bool verbose, bool merge_double_vertices)
{
  std::string s=name;

  if (s.rfind(".stl") == s.size()-4 || s.rfind(".STL") == s.size()-4)
  {
    return loadSTL(name, merge_double_vertices);
  }
  else if (s.rfind(".ply") == s.size()-4 || s.rfind(".PLY") == s.size()-4)
  {
    return loadPLY(name);
  }

  return loadDepth(name, spath, verbose);
}